

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::InlinePass::AddPointerToType
          (InlinePass *this,uint32_t type_id,StorageClass storage_class)

{
  IRContext *pIVar1;
  undefined8 type;
  uint32_t res_id;
  Instruction *this_00;
  pointer pOVar2;
  SmallVector<unsigned_int,_2UL> *this_01;
  long lVar3;
  Operand *__cur;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_02;
  size_type __dnew;
  string message;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_108;
  undefined1 local_e8 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_c8;
  undefined1 local_b8 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_98;
  undefined1 local_90 [16];
  IRContext *local_80;
  _Hash_node_base local_78;
  __node_base local_70;
  size_type local_68;
  float local_60;
  undefined1 local_58 [32];
  __node_base local_38;
  
  pIVar1 = (this->super_Pass).context_;
  res_id = Module::TakeNextIdBound
                     ((pIVar1->module_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                      .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if ((res_id == 0) && ((pIVar1->consumer_).super__Function_base._M_manager != (_Manager_type)0x0))
  {
    local_90._0_8_ = &local_80;
    local_e8._0_8_ = (IRContext *)0x25;
    local_90._0_8_ = std::__cxx11::string::_M_create((ulong *)local_90,(ulong)local_e8);
    local_80 = (IRContext *)local_e8._0_8_;
    *(undefined8 *)&(((MessageConsumer *)local_90._0_8_)->super__Function_base)._M_functor =
         0x667265766f204449;
    *(undefined8 *)
     ((long)&(((MessageConsumer *)local_90._0_8_)->super__Function_base)._M_functor + 8) =
         0x797254202e776f6c;
    (((MessageConsumer *)local_90._0_8_)->super__Function_base)._M_manager =
         (_Manager_type)0x676e696e6e757220;
    ((MessageConsumer *)local_90._0_8_)->_M_invoker = (_Invoker_type)0x746361706d6f6320;
    *(undefined8 *)((long)&((MessageConsumer *)local_90._0_8_)->_M_invoker + 5) = 0x2e7364692d746361
    ;
    local_90._8_8_ = local_e8._0_8_;
    *(char *)((long)(spv_context *)local_e8._0_8_ +
             (long)&((MessageConsumer *)local_90._0_8_)->super__Function_base) = '\0';
    local_e8._0_8_ = (_func_int **)0x0;
    local_e8._8_8_ = 0;
    local_e8._16_4_ = (array<signed_char,_4UL>)0x0;
    local_e8._20_4_ = (array<signed_char,_4UL>)0x0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&pIVar1->consumer_,SPV_MSG_ERROR,"",(spv_position_t *)local_e8,(char *)local_90._0_8_
              );
    if ((MessageConsumer *)local_90._0_8_ != (MessageConsumer *)&local_80) {
      operator_delete((void *)local_90._0_8_,(ulong)((long)&local_80->syntax_context_ + 1));
    }
  }
  if (res_id != 0) {
    this_00 = (Instruction *)operator_new(0x70);
    pIVar1 = (this->super_Pass).context_;
    local_e8._24_8_ = local_e8 + 0x10;
    local_e8._0_8_ = &PTR__SmallVector_003e9b28;
    local_c8._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_e8._16_4_ = storage_class;
    local_e8._8_8_ = 1;
    this_01 = (SmallVector<unsigned_int,_2UL> *)(local_90 + 8);
    local_90._0_4_ = 0x11;
    local_90._8_8_ = &PTR__SmallVector_003e9b28;
    local_80 = (IRContext *)0x0;
    local_70._M_nxt = &local_78;
    local_68 = 0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (this_01,(SmallVector<unsigned_int,_2UL> *)local_e8);
    local_b8._24_8_ = local_b8 + 0x10;
    local_b8._0_8_ = &PTR__SmallVector_003e9b28;
    local_98._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_b8._8_8_ = 1;
    local_60 = 1.4013e-45;
    local_58._0_8_ = &PTR__SmallVector_003e9b28;
    local_58._8_8_ = (__node_base_ptr)0x0;
    local_58._24_8_ = local_58 + 0x10;
    local_38._M_nxt = (_Hash_node_base *)0x0;
    local_b8._16_4_ = type_id;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_58,(SmallVector<unsigned_int,_2UL> *)local_b8
              );
    local_108.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar3 = 0x60;
    pOVar2 = (pointer)operator_new(0x60);
    local_108.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = pOVar2 + 2;
    local_108.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start = pOVar2;
    do {
      pOVar2->type = *(spv_operand_type_t *)
                      &this_01[-1].large_data_._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
      (pOVar2->words)._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003e9b28;
      (pOVar2->words).size_ = 0;
      (pOVar2->words).small_data_ = (uint *)(pOVar2->words).buffer;
      (pOVar2->words).large_data_._M_t.
      super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=(&pOVar2->words,this_01);
      pOVar2 = pOVar2 + 1;
      this_01 = (SmallVector<unsigned_int,_2UL> *)&this_01[1].size_;
      lVar3 = lVar3 + -0x30;
    } while (lVar3 != 0);
    local_108.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_finish = pOVar2;
    Instruction::Instruction(this_00,pIVar1,OpTypePointer,0,res_id,&local_108);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              (&local_108);
    lVar3 = -0x60;
    this_02 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&local_38
    ;
    do {
      *(undefined ***)(this_02 + -0x20) = &PTR__SmallVector_003e9b28;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_02 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (this_02,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_02);
      }
      *(undefined8 *)this_02 = 0;
      this_02 = this_02 + -0x30;
      lVar3 = lVar3 + 0x30;
    } while (lVar3 != 0);
    local_b8._0_8_ = &PTR__SmallVector_003e9b28;
    if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )local_98._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_98,local_98._M_head_impl);
    }
    local_e8._0_8_ = &PTR__SmallVector_003e9b28;
    if (local_c8._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl !=
        (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_c8,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 local_c8._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl);
    }
    pIVar1 = (this->super_Pass).context_;
    utils::IntrusiveList<spvtools::opt::Instruction>::push_back
              (&(((pIVar1->module_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                  .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                types_values_).super_IntrusiveList<spvtools::opt::Instruction>,this_00);
    if ((pIVar1->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
      analysis::DefUseManager::AnalyzeInstDefUse
                ((pIVar1->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,
                 *(Instruction **)
                  ((long)&(((pIVar1->module_)._M_t.
                            super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                            .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                          types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 0x18));
    }
    pIVar1 = (this->super_Pass).context_;
    if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
      IRContext::BuildTypeManager(pIVar1);
    }
    analysis::TypeManager::GetTypeAndPointerType
              ((TypeManager *)local_90,
               (uint32_t)
               (pIVar1->type_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl,
               type_id);
    type = local_90._8_8_;
    pIVar1 = (this->super_Pass).context_;
    if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
      IRContext::BuildTypeManager(pIVar1);
    }
    analysis::TypeManager::RegisterType
              ((pIVar1->type_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl,
               res_id,(Type *)type);
    (*(code *)(*(spv_context *)type)->opcode_table)(type);
  }
  return res_id;
}

Assistant:

uint32_t InlinePass::AddPointerToType(uint32_t type_id,
                                      spv::StorageClass storage_class) {
  uint32_t resultId = context()->TakeNextId();
  if (resultId == 0) {
    return resultId;
  }

  std::unique_ptr<Instruction> type_inst(
      new Instruction(context(), spv::Op::OpTypePointer, 0, resultId,
                      {{spv_operand_type_t::SPV_OPERAND_TYPE_STORAGE_CLASS,
                        {uint32_t(storage_class)}},
                       {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {type_id}}}));
  context()->AddType(std::move(type_inst));
  analysis::Type* pointeeTy;
  std::unique_ptr<analysis::Pointer> pointerTy;
  std::tie(pointeeTy, pointerTy) =
      context()->get_type_mgr()->GetTypeAndPointerType(
          type_id, spv::StorageClass::Function);
  context()->get_type_mgr()->RegisterType(resultId, *pointerTy);
  return resultId;
}